

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonBlobExpand(JsonParse *pParse,u32 N)

{
  void *pvVar1;
  uint in_ESI;
  undefined8 *in_RDI;
  u32 t;
  u8 *aNew;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  if (*(int *)((long)in_RDI + 0xc) == 0) {
    uVar2 = 100;
  }
  else {
    uVar2 = *(int *)((long)in_RDI + 0xc) << 1;
  }
  if (uVar2 < in_ESI) {
    uVar2 = in_ESI + 100;
  }
  pvVar1 = sqlite3DbRealloc((sqlite3 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            &DAT_aaaaaaaaaaaaaaaa,CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  if (pvVar1 != (void *)0x0) {
    *in_RDI = pvVar1;
    *(uint *)((long)in_RDI + 0xc) = uVar2;
  }
  else {
    *(undefined1 *)((long)in_RDI + 0x2f) = 1;
  }
  local_4 = (uint)(pvVar1 == (void *)0x0);
  return local_4;
}

Assistant:

static int jsonBlobExpand(JsonParse *pParse, u32 N){
  u8 *aNew;
  u32 t;
  assert( N>pParse->nBlobAlloc );
  if( pParse->nBlobAlloc==0 ){
    t = 100;
  }else{
    t = pParse->nBlobAlloc*2;
  }
  if( t<N ) t = N+100;
  aNew = sqlite3DbRealloc(pParse->db, pParse->aBlob, t);
  if( aNew==0 ){ pParse->oom = 1; return 1; }
  pParse->aBlob = aNew;
  pParse->nBlobAlloc = t;
  return 0;
}